

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O3

sfts_t * sfts_openro(char *name,...)

{
  int *status;
  char in_AL;
  int iVar1;
  sfts_t *f;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *fmt;
  int h;
  bool bVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int hduok;
  int dataok;
  va_list args;
  char _msg [31];
  int local_138;
  int local_134;
  char *local_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char local_108 [30];
  undefined1 local_ea;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  f = (sfts_t *)g_malloc0(0x28);
  status = &f->stat;
  pcVar2 = (char *)g_strdup(name);
  f->name = pcVar2;
  ffopentest(10,(fitsfile **)f,name,0,status);
  local_120 = &stack0x00000008;
  local_128 = 0x3000000010;
  if ((int)local_e0 != -0x21524111) {
    local_130 = name;
    local_118 = local_e8;
    iVar1 = sfts_get_nhdus(f);
    if (0 < iVar1) {
      h = 1;
      do {
        sfts_goto_hdu(f,h);
        ffvcks(f->fts,&local_134,&local_138,status);
        if (f->stat != 0) {
          if (f->name == (char *)0x0) {
            g_strdup("memory");
          }
          else {
            g_path_get_basename();
          }
          pcVar2 = local_108;
          ffgerr(*status,pcVar2);
          local_ea = 0;
          fmt = "FITS: %s: %s";
          iVar1 = 0xee;
LAB_0010be4f:
          _p2sc_msg("sfts_openro",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                    ,iVar1,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,fmt,pcVar2);
          exit(1);
        }
        pcVar2 = local_130;
        if (local_134 == -1) {
          fmt = "FITS: incorrect DATASUM: %s";
          iVar1 = 0xf1;
          goto LAB_0010be4f;
        }
        if (local_138 == -1) {
          fmt = "FITS: incorrect CHECKSUM: %s";
          iVar1 = 0xf3;
          goto LAB_0010be4f;
        }
        bVar3 = h != iVar1;
        h = h + 1;
      } while (bVar3);
    }
    sfts_goto_hdu(f,1);
  }
  return f;
}

Assistant:

sfts_t *sfts_openro(const char *name, ...) {
    sfts_t *f = (sfts_t *) g_malloc0(sizeof *f);
    int *s = &f->stat, no_verify = 0;

    f->name = g_strdup(name);
    fits_open_file(&f->fts, name, READONLY, s);

    va_list args;

    va_start(args, name);
    no_verify = va_arg(args, int);
    va_end(args);

    /* verify checksums */
    if (no_verify != SFTS_SUM_NOVERIFY) {
        int dataok, hduok, i, num = sfts_get_nhdus(f);
        for (i = 1; i <= num; ++i) {
            sfts_goto_hdu(f, i);
            fits_verify_chksum(f->fts, &dataok, &hduok, s);
            CHK_FTS(f);

            if (dataok == -1)
                P2SC_Msg(LVL_FATAL_FITS, "FITS: incorrect DATASUM: %s", name);
            if (hduok == -1)
                P2SC_Msg(LVL_FATAL_FITS, "FITS: incorrect CHECKSUM: %s", name);
        }
        sfts_goto_hdu(f, 1);
    }

    return f;
}